

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::toString(QLocale *this,QDate date,FormatType format,QCalendar cal)

{
  QStringView format_00;
  bool bVar1;
  QLocalePrivate *pQVar2;
  int in_ECX;
  storage_type_conflict *in_RDX;
  QLocale *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString format_str;
  QVariant res;
  QVariant *in_stack_fffffffffffffef8;
  QVariant *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  QSystemLocale *in_stack_ffffffffffffff10;
  FormatType in_stack_ffffffffffffff44;
  QLocale *in_stack_ffffffffffffff48;
  QCalendar in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QDate QVar3;
  undefined1 local_48 [32];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QDate::isValid((QDate *)in_stack_ffffffffffffff10);
  if (bVar1) {
    bVar1 = QCalendar::isGregorian((QCalendar *)in_stack_ffffffffffffff10);
    if ((bVar1) &&
       (pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                           ((QSharedDataPointer<QLocalePrivate> *)0x4cdc61),
       pQVar2->m_data == &systemLocaleData)) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffff10 = systemLocale();
      QVar3.jd._7_1_ = in_stack_ffffffffffffff0f;
      QVar3.jd._0_7_ = in_stack_ffffffffffffff08;
      ::QVariant::QVariant(in_stack_ffffffffffffff00,QVar3);
      (*in_stack_ffffffffffffff10->_vptr_QSystemLocale[2])
                (&local_28,in_stack_ffffffffffffff10,(ulong)(0x12 - (in_ECX == 0)),local_48);
      ::QVariant::~QVariant(in_stack_ffffffffffffff00);
      bVar1 = ::QVariant::isNull((QVariant *)
                                 CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      in_stack_ffffffffffffff0f = bVar1;
      if (!bVar1) {
        ::QVariant::toString(in_stack_fffffffffffffef8);
      }
      ::QVariant::~QVariant(in_stack_ffffffffffffff00);
      if (!bVar1) goto LAB_004cde78;
    }
    QVar3.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    dateFormat(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_stack_ffffffffffffff10,
               (QString *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    format_00.m_data = in_RDX;
    format_00.m_size = in_stack_ffffffffffffff78;
    toString(in_RSI,QVar3,format_00,in_stack_ffffffffffffff70);
    QString::~QString((QString *)0x4cde55);
  }
  else {
    QString::QString((QString *)0x4cdc3c);
  }
LAB_004cde78:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QLocale::toString(QDate date, FormatType format, QCalendar cal) const
{
    if (!date.isValid())
        return QString();

#ifndef QT_NO_SYSTEMLOCALE
    if (cal.isGregorian() && d->m_data == &systemLocaleData) {
        QVariant res = systemLocale()->query(format == LongFormat
                                             ? QSystemLocale::DateToStringLong
                                             : QSystemLocale::DateToStringShort,
                                             date);
        if (!res.isNull())
            return res.toString();
    }
#endif

    QString format_str = dateFormat(format);
    return toString(date, format_str, cal);
}